

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int replace_bytes(uchar *bytes,size_t bytes_len,uchar **bytes_out,size_t *bytes_len_out)

{
  _Bool _Var1;
  uchar *local_38;
  uchar *new_bytes;
  size_t *bytes_len_out_local;
  uchar **bytes_out_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  local_38 = (uchar *)0x0;
  if (((bytes != (uchar *)0x0) == (bytes_len != 0)) &&
     ((*bytes_out != (uchar *)0x0) == (*bytes_len_out != 0))) {
    new_bytes = (uchar *)bytes_len_out;
    bytes_len_out_local = (size_t *)bytes_out;
    bytes_out_local = (uchar **)bytes_len;
    bytes_len_local = (size_t)bytes;
    _Var1 = clone_bytes(&local_38,bytes,bytes_len);
    if (_Var1) {
      clear_and_free((void *)*bytes_len_out_local,*(size_t *)new_bytes);
      *bytes_len_out_local = (size_t)local_38;
      *(uchar ***)new_bytes = bytes_out_local;
      bytes_local._4_4_ = 0;
    }
    else {
      bytes_local._4_4_ = -3;
    }
  }
  else {
    bytes_local._4_4_ = -2;
  }
  return bytes_local._4_4_;
}

Assistant:

int replace_bytes(const unsigned char *bytes, size_t bytes_len,
                  unsigned char **bytes_out, size_t *bytes_len_out)
{
    unsigned char *new_bytes = NULL;

    if (BYTES_INVALID(bytes, bytes_len) || BYTES_INVALID(*bytes_out, *bytes_len_out))
        return WALLY_EINVAL;

    /* TODO: Avoid reallocation if new bytes is smaller than the existing one */
    if (!clone_bytes(&new_bytes, bytes, bytes_len))
        return WALLY_ENOMEM;

    clear_and_free(*bytes_out, *bytes_len_out);
    *bytes_out = new_bytes;
    *bytes_len_out = bytes_len;
    return WALLY_OK;
}